

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntWeakPtr<Diligent::DeviceContextVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>::operator=
          (RefCntWeakPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> *pRVar1;
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> local_20;
  
  RefCntWeakPtr(&local_20,pObj);
  pRVar1 = operator=(this,&local_20);
  Release(&local_20);
  return pRVar1;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }